

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::transform_mcu(jpeg_decoder *this,int mcu_row)

{
  byte local_39;
  int local_2c;
  uint8 *puStack_28;
  int mcu_block;
  uint8 *pDst_ptr;
  jpgd_block_coeff_t *pSrc_ptr;
  int mcu_row_local;
  jpeg_decoder *this_local;
  
  pDst_ptr = (uint8 *)this->m_pMCU_coefficients;
  if (this->m_max_blocks_per_row <= mcu_row * this->m_blocks_per_mcu) {
    stop_decoding(this,JPGD_DECODE_ERROR);
  }
  puStack_28 = this->m_pSample_buf + mcu_row * this->m_blocks_per_mcu * 0x40;
  for (local_2c = 0; local_2c < this->m_blocks_per_mcu; local_2c = local_2c + 1) {
    local_39 = 0;
    if ((this->m_flags & 2) == 0) {
      local_39 = this->m_has_sse2;
    }
    jpgd::idct((jpgd_block_coeff_t *)pDst_ptr,puStack_28,this->m_mcu_block_max_zag[local_2c],
               (bool)(local_39 & 1));
    pDst_ptr = pDst_ptr + 0x80;
    puStack_28 = puStack_28 + 0x40;
  }
  return;
}

Assistant:

void jpeg_decoder::transform_mcu(int mcu_row)
	{
		jpgd_block_coeff_t* pSrc_ptr = m_pMCU_coefficients;
		if (mcu_row * m_blocks_per_mcu >= m_max_blocks_per_row)
			stop_decoding(JPGD_DECODE_ERROR);

		uint8* pDst_ptr = m_pSample_buf + mcu_row * m_blocks_per_mcu * 64;

		for (int mcu_block = 0; mcu_block < m_blocks_per_mcu; mcu_block++)
		{
			idct(pSrc_ptr, pDst_ptr, m_mcu_block_max_zag[mcu_block], ((m_flags & cFlagDisableSIMD) == 0) && m_has_sse2);
			pSrc_ptr += 64;
			pDst_ptr += 64;
		}
	}